

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int32_suite::test_min(void)

{
  undefined4 local_5c;
  value local_58 [2];
  int local_50;
  type local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [5];
  
  decoder.current.view._M_str._3_4_ = 0xc4;
  decoder.current.view._M_str._7_1_ = 0x80;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[5]>
            ((decoder *)local_38,(uchar (*) [5])((long)&decoder.current.view._M_str + 3));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xc4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1aa,"void int32_suite::test_min()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int32>((decoder *)local_38);
  local_50 = std::numeric_limits<int>::min();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.value<token::int32>()","std::numeric_limits<token::int32::type>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ac,"void int32_suite::test_min()",local_4c,&local_50);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_58[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_5c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x1ae,"void int32_suite::test_min()",local_58,&local_5c);
  return;
}

Assistant:

void test_min()
{
    const value_type input[] = { token::code::int32, 0x00, 0x00, 0x00, 0x80 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int32>(),
                              std::numeric_limits<token::int32::type>::min());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}